

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_produce(writer *w,TypeDef *type,cache *c)

{
  bool bVar1;
  anon_class_8_1_89897ddb_conflict4 local_c0;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_b8;
  anon_class_8_1_898e5d9c local_98;
  anon_class_8_1_89897ddb local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined1 local_78 [8];
  finish_with wrap;
  undefined1 local_50 [7];
  bool lean_and_mean;
  generic_param_guard guard;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  char *format;
  cache *c_local;
  TypeDef *type_local;
  writer *w_local;
  
  winmd::reader::TypeDef::GenericParam
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard,type);
  writer::push_generic_params
            ((writer *)local_50,(pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)w)
  ;
  bVar1 = can_produce(type,c);
  wrap_lean_and_mean((cppwinrt *)local_78,w,(bool)(~bVar1 & 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,
             "    template <typename D%>\n    struct produce<D, %> : produce_base<D, %>\n    {\n%%    };\n"
            );
  local_90 = bind<&cppwinrt::write_comma_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                       ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
  winmd::reader::TypeDef::MethodList(&local_b8,type);
  local_98 = bind_each<&cppwinrt::write_produce_method,_std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>_>
                       (&local_b8);
  local_c0 = bind<&cppwinrt::write_fast_produce_methods,_const_winmd::reader::TypeDef_&>(type);
  writer_base<cppwinrt::writer>::
  write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_winmd::reader::TypeDef,_winmd::reader::TypeDef,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_88,&local_90,type,type,&local_98,
             &local_c0);
  finish_with::~finish_with((finish_with *)local_78);
  writer::generic_param_guard::~generic_param_guard((generic_param_guard *)local_50);
  return;
}

Assistant:

static void write_produce(writer& w, TypeDef const& type, cache const& c)
    {
        auto format = R"(    template <typename D%>
    struct produce<D, %> : produce_base<D, %>
    {
%%    };
)";

        auto generics = type.GenericParam();
        auto guard{ w.push_generic_params(generics) };
        bool const lean_and_mean = !can_produce(type, c);

        auto wrap = wrap_lean_and_mean(w, lean_and_mean);

        w.write(format,
            bind<write_comma_generic_typenames>(generics),
            type,
            type,
            bind_each<write_produce_method>(type.MethodList()),
            bind<write_fast_produce_methods>(type));
    }